

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcp-quicksort.cpp
# Opt level: O2

void lcpsort<false>(uchar **strings,Lcp *lcps,int lo,int hi)

{
  int iVar1;
  int iVar2;
  Lcp LVar3;
  uchar *puVar4;
  ulong uVar5;
  int hi_00;
  ulong uVar6;
  int lo_00;
  
LAB_001d3507:
  if (hi <= lo) {
    return;
  }
  iVar1 = lcps[lo];
  uVar6 = (ulong)(lo + 1);
  hi_00 = hi;
  lo_00 = lo;
LAB_001d3521:
  do {
    uVar5 = (ulong)(int)uVar6;
    while( true ) {
      if (hi_00 < (int)uVar5) {
        strsort(strings,lcps,lo_00,hi_00);
        lcpsort<false>(strings,lcps,lo,lo_00 + -1);
        lo = hi_00 + 1;
        goto LAB_001d3507;
      }
      iVar2 = lcps[uVar5];
      if (iVar2 < iVar1) {
        puVar4 = strings[uVar5];
        strings[uVar5] = strings[hi_00];
        strings[hi_00] = puVar4;
        lcps[uVar5] = lcps[hi_00];
        lcps[hi_00] = iVar2;
        uVar6 = uVar5 & 0xffffffff;
        hi_00 = hi_00 + -1;
        goto LAB_001d3521;
      }
      if (iVar1 < iVar2) break;
      uVar5 = uVar5 + 1;
    }
    uVar6 = (ulong)((int)uVar5 + 1);
    puVar4 = strings[lo_00];
    strings[lo_00] = strings[uVar5];
    strings[uVar5] = puVar4;
    LVar3 = lcps[lo_00];
    lcps[lo_00] = iVar2;
    lcps[uVar5] = LVar3;
    lo_00 = lo_00 + 1;
  } while( true );
}

Assistant:

void lcpsort( unsigned char * strings[], Lcp lcps[], int lo, int hi ) {
  if ( hi <= lo ) return;
  int lt = lo, gt = hi;

  Lcp pivot = lcps[lo];
  for( int i = lo + 1; i <= gt; ) {
    if      ( ascending ? lcps[i] > pivot : lcps[i] < pivot ) exch( strings, lcps, i, gt--);
    else if ( ascending ? lcps[i] < pivot : lcps[i] > pivot ) exch( strings, lcps, lt++, i++);
    else            i++;
  }

  strsort( strings, lcps, lt, gt );
  lcpsort<ascending>( strings, lcps, lo, lt-1 );
  lcpsort<ascending>( strings, lcps, gt+1, hi );
}